

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

string * __thiscall
helics::HandleManager::generateName_abi_cxx11_
          (string *__return_storage_ptr__,HandleManager *this,InterfaceType what)

{
  size_type __val;
  undefined3 in_register_00000011;
  int iVar1;
  char *__s;
  string local_30;
  
  iVar1 = CONCAT31(in_register_00000011,what);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 == 0x74) {
    __s = "_translator_";
  }
  else if (iVar1 == 0x66) {
    __s = "_filter_";
  }
  else if (iVar1 == 0x69) {
    __s = "_input_";
  }
  else if (iVar1 == 0x70) {
    __s = "_pub_";
  }
  else if (iVar1 == 0x73) {
    __s = "_sink_";
  }
  else if (iVar1 == 0x65) {
    __s = "_ept_";
  }
  else {
    __s = "_handle_";
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,__s);
  __val = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    (&this->handles);
  CLI::std::__cxx11::to_string(&local_30,__val);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string HandleManager::generateName(InterfaceType what) const
{
    std::string base;
    switch (what) {
        case InterfaceType::ENDPOINT:
            base = "_ept_";
            break;
        case InterfaceType::INPUT:
            base = "_input_";
            break;
        case InterfaceType::PUBLICATION:
            base = "_pub_";
            break;
        case InterfaceType::FILTER:
            base = "_filter_";
            break;
        case InterfaceType::TRANSLATOR:
            base = "_translator_";
            break;
        case InterfaceType::SINK:
            base = "_sink_";
            break;
        default:
            base = "_handle_";
            break;
    }
    base.append(std::to_string(handles.size()));
    return base;
}